

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddConcavePolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  ImVec2 IVar1;
  uint *puVar2;
  ImVec2 *pIVar3;
  ulong uVar4;
  ImDrawVert *pIVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ImDrawListSharedData *pIVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  ImVec2 IVar18;
  ImVec2 IVar19;
  uint triangle [3];
  ImTriangulator triangulator;
  uint local_a8;
  int iStack_a4;
  int local_a0;
  ulong local_98;
  int local_8c;
  ImTriangulator local_88;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (0xffffff < col && 2 < points_count) {
    IVar1 = this->_Data->TexUvWhitePixel;
    local_88._TrianglesLeft = 0;
    local_88._Reflexes.Data = (ImTriangulatorNode **)0x0;
    local_88._Reflexes.Size = 0;
    local_88._Nodes = (ImTriangulatorNode *)0x0;
    local_88._Ears.Data = (ImTriangulatorNode **)0x0;
    local_88._Ears.Size = 0;
    if ((this->Flags & 4) == 0) {
      PrimReserve(this,points_count * 3 + -6,points_count);
      pIVar5 = this->_VtxWritePtr;
      uVar4 = 0;
      do {
        pIVar5->pos = points[uVar4];
        this->_VtxWritePtr->uv = IVar1;
        pIVar5 = this->_VtxWritePtr;
        pIVar5->col = col;
        pIVar5 = pIVar5 + 1;
        this->_VtxWritePtr = pIVar5;
        uVar4 = uVar4 + 1;
      } while ((uint)points_count != uVar4);
      pIVar11 = this->_Data;
      iVar6 = points_count * 0x30 >> 3;
      if ((pIVar11->TempBuffer).Capacity <= iVar6) {
        iVar6 = iVar6 + 1;
        pIVar3 = (pIVar11->TempBuffer).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          ImGui::MemFree(pIVar3);
        }
        pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 * 8);
        (pIVar11->TempBuffer).Data = pIVar3;
        (pIVar11->TempBuffer).Capacity = iVar6;
        pIVar11 = this->_Data;
      }
      ImTriangulator::Init(&local_88,points,points_count,(pIVar11->TempBuffer).Data);
      local_8c = points_count;
      if (0 < local_88._TrianglesLeft) {
        do {
          ImTriangulator::GetNextTriangle(&local_88,&local_a8);
          puVar2 = this->_IdxWritePtr;
          *puVar2 = local_a8 + this->_VtxCurrentIdx;
          puVar2[1] = iStack_a4 + this->_VtxCurrentIdx;
          puVar2[2] = local_a0 + this->_VtxCurrentIdx;
          this->_IdxWritePtr = puVar2 + 3;
        } while (0 < local_88._TrianglesLeft);
      }
    }
    else {
      local_58 = ZEXT416((uint)this->_FringeScale);
      local_8c = points_count * 2;
      PrimReserve(this,points_count * 9 + -6,local_8c);
      local_98 = (ulong)this->_VtxCurrentIdx;
      pIVar11 = this->_Data;
      iVar6 = points_count * 0x30 >> 3;
      if ((pIVar11->TempBuffer).Capacity <= iVar6) {
        iVar6 = iVar6 + 1;
        pIVar3 = (pIVar11->TempBuffer).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          ImGui::MemFree(pIVar3);
        }
        pIVar3 = (ImVec2 *)ImGui::MemAlloc((long)iVar6 * 8);
        (pIVar11->TempBuffer).Data = pIVar3;
        (pIVar11->TempBuffer).Capacity = iVar6;
        pIVar11 = this->_Data;
      }
      ImTriangulator::Init(&local_88,points,points_count,(pIVar11->TempBuffer).Data);
      if (0 < local_88._TrianglesLeft) {
        iVar6 = (int)local_98;
        local_48 = CONCAT44(iVar6,iVar6);
        uStack_40 = 0;
        do {
          ImTriangulator::GetNextTriangle(&local_88,&local_a8);
          puVar2 = this->_IdxWritePtr;
          *(ulong *)puVar2 = CONCAT44(iStack_a4 * 2 + local_48._4_4_,local_a8 * 2 + (int)local_48);
          puVar2[2] = iVar6 + local_a0 * 2;
          this->_IdxWritePtr = puVar2 + 3;
        } while (0 < local_88._TrianglesLeft);
      }
      pIVar11 = this->_Data;
      uVar4 = (ulong)(uint)points_count;
      if ((pIVar11->TempBuffer).Capacity < points_count) {
        pIVar3 = (pIVar11->TempBuffer).Data;
        if (pIVar3 != (ImVec2 *)0x0) {
          ImGui::MemFree(pIVar3);
        }
        pIVar3 = (ImVec2 *)ImGui::MemAlloc(uVar4 * 8);
        (pIVar11->TempBuffer).Data = pIVar3;
        (pIVar11->TempBuffer).Capacity = points_count;
        pIVar11 = this->_Data;
      }
      pIVar3 = (pIVar11->TempBuffer).Data;
      uVar12 = (ulong)(points_count - 1);
      uVar7 = 0;
      uVar9 = uVar12;
      do {
        iVar6 = (int)uVar9;
        fVar13 = points[uVar7].x - points[iVar6].x;
        fVar14 = points[uVar7].y - points[iVar6].y;
        auVar15._0_4_ = fVar13 * fVar13 + fVar14 * fVar14;
        auVar15._4_4_ = fVar14;
        auVar15._8_8_ = 0;
        if (0.0 < auVar15._0_4_) {
          auVar15 = rsqrtss(auVar15,auVar15);
          fVar13 = fVar13 * auVar15._0_4_;
          fVar14 = fVar14 * auVar15._0_4_;
        }
        pIVar3[iVar6].x = fVar14;
        pIVar3[iVar6].y = -fVar13;
        uVar9 = uVar7 & 0xffffffff;
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
      uVar7 = 0;
      uVar9 = local_98 & 0xffffffff;
      do {
        iVar6 = (int)uVar12;
        fVar13 = (pIVar3[uVar7].x + pIVar3[iVar6].x) * 0.5;
        fVar14 = (pIVar3[uVar7].y + pIVar3[iVar6].y) * 0.5;
        fVar16 = fVar13 * fVar13 + fVar14 * fVar14;
        if (1e-06 < fVar16) {
          fVar16 = 1.0 / fVar16;
          fVar17 = 100.0;
          if (fVar16 <= 100.0) {
            fVar17 = fVar16;
          }
          fVar13 = fVar13 * fVar17;
          fVar14 = fVar14 * fVar17;
        }
        fVar13 = fVar13 * (float)local_58._0_4_ * 0.5;
        fVar14 = fVar14 * (float)local_58._0_4_ * 0.5;
        pIVar5 = this->_VtxWritePtr;
        IVar18.x = points[uVar7].x - fVar13;
        IVar18.y = points[uVar7].y - fVar14;
        pIVar5->pos = IVar18;
        pIVar5->uv = IVar1;
        pIVar5 = this->_VtxWritePtr;
        pIVar5->col = col;
        IVar19.x = points[uVar7].x + fVar13;
        IVar19.y = points[uVar7].y + fVar14;
        pIVar5[1].pos = IVar19;
        pIVar5[1].uv = IVar1;
        pIVar5 = this->_VtxWritePtr;
        pIVar5[1].col = col & 0xffffff;
        this->_VtxWritePtr = pIVar5 + 2;
        puVar2 = this->_IdxWritePtr;
        uVar8 = (uint)uVar9;
        *puVar2 = uVar8;
        puVar2[1] = (int)local_98 + iVar6 * 2;
        uVar10 = (int)local_98 + 1 + iVar6 * 2;
        puVar2[2] = uVar10;
        puVar2[3] = uVar10;
        puVar2[4] = uVar8 + 1;
        puVar2[5] = uVar8;
        this->_IdxWritePtr = puVar2 + 6;
        uVar12 = uVar7 & 0xffffffff;
        uVar7 = uVar7 + 1;
        uVar9 = (ulong)(uVar8 + 2);
      } while (uVar4 != uVar7);
    }
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + local_8c;
  }
  return;
}

Assistant:

void ImDrawList::AddConcavePolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3 || (col & IM_COL32_A_MASK) == 0)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;
    ImTriangulator triangulator;
    unsigned int triangle[3];
    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count - 2) * 3 + points_count * 6;
        const int vtx_count = (points_count * 2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx + 1;

        _Data->TempBuffer.reserve_discard((ImTriangulator::EstimateScratchBufferSize(points_count) + sizeof(ImVec2)) / sizeof(ImVec2));
        triangulator.Init(points, points_count, _Data->TempBuffer.Data);
        while (triangulator._TrianglesLeft > 0)
        {
            triangulator.GetNextTriangle(triangle);
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (triangle[0] << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (triangle[1] << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx + (triangle[2] << 1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        _Data->TempBuffer.reserve_discard(points_count);
        ImVec2* temp_normals = _Data->TempBuffer.Data;
        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (i0 << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx + (i1 << 1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count - 2) * 3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        _Data->TempBuffer.reserve_discard((ImTriangulator::EstimateScratchBufferSize(points_count) + sizeof(ImVec2)) / sizeof(ImVec2));
        triangulator.Init(points, points_count, _Data->TempBuffer.Data);
        while (triangulator._TrianglesLeft > 0)
        {
            triangulator.GetNextTriangle(triangle);
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx + triangle[0]); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + triangle[1]); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + triangle[2]);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}